

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::pack_color_selectors
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_short *puVar5;
  symbol_codec *in_RDX;
  symbol_codec *in_RSI;
  long in_RDI;
  uint32 i_2;
  uint32 prev_selector_1;
  uint32 selector_1;
  uint32 c_1;
  symbol_codec codec;
  static_huffman_data_model dm;
  uint32 i_1;
  uint32 prev_selector;
  uint32 selector;
  uint32 c;
  symbol_histogram hist;
  uint i;
  vector<unsigned_int> remapped_selectors;
  undefined4 in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  symbol_codec *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  uint local_140;
  uint local_13c;
  int local_134;
  symbol_codec local_130;
  static_huffman_data_model local_98;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar6;
  uint i_00;
  undefined1 in_stack_ffffffffffffffdf;
  static_huffman_data_model *in_stack_ffffffffffffffe0;
  
  vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x1510));
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  uVar6 = 0;
  while( true ) {
    i_00 = uVar6;
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x1510));
    if (uVar2 <= uVar6) break;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x1510),i_00);
    uVar6 = *puVar4;
    puVar5 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)in_RDX,i_00);
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)&stack0xffffffffffffffd8,(uint)*puVar5);
    *puVar4 = uVar6;
    uVar6 = i_00 + 1;
  }
  symbol_histogram::symbol_histogram
            ((symbol_histogram *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  local_5c = 0;
  local_60 = 0;
  while( true ) {
    uVar6 = local_60;
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)&stack0xffffffffffffffd8);
    uVar1 = local_5c;
    if (uVar2 <= uVar6) break;
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)&stack0xffffffffffffffd8,local_60);
    local_58 = uVar1 ^ *puVar4;
    local_5c = local_58 ^ local_5c;
    for (local_54 = 8; local_54 != 0; local_54 = local_54 + -1) {
      symbol_histogram::inc_freq
                ((symbol_histogram *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (uint)((ulong)in_stack_fffffffffffffe58 >> 0x20),(uint)in_stack_fffffffffffffe58);
      local_58 = local_58 >> 4;
    }
    local_60 = local_60 + 1;
  }
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  static_huffman_data_model::init(&local_98,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec
            ((symbol_codec *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  symbol_codec::start_encoding(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  symbol_codec::encode_transmit_static_huffman_data_model
            (in_RDX,in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
             (static_huffman_data_model *)CONCAT44(i_00,in_stack_ffffffffffffffd0));
  local_13c = 0;
  local_140 = 0;
  while( true ) {
    uVar2 = local_140;
    uVar3 = vector<unsigned_int>::size((vector<unsigned_int> *)&stack0xffffffffffffffd8);
    if (uVar3 <= uVar2) break;
    uVar6 = local_13c;
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)&stack0xffffffffffffffd8,local_140);
    local_13c = uVar6 ^ *puVar4 ^ local_13c;
    for (local_134 = 8; local_134 != 0; local_134 = local_134 + -1) {
      symbol_codec::encode
                ((symbol_codec *)CONCAT44(uVar6,in_stack_fffffffffffffe60),
                 (uint)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 (static_huffman_data_model *)in_stack_fffffffffffffe50);
    }
    local_140 = local_140 + 1;
  }
  symbol_codec::stop_encoding(in_stack_fffffffffffffe50,SUB41(in_stack_fffffffffffffe4c >> 0x18,0));
  symbol_codec::get_encoding_buf(&local_130);
  vector<unsigned_char>::swap
            ((vector<unsigned_char> *)in_RSI,
             (vector<unsigned_char> *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
  ;
  symbol_codec::~symbol_codec(in_RSI);
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)in_RSI);
  symbol_histogram::~symbol_histogram((symbol_histogram *)0x1c94b3);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_RSI);
  return true;
}

Assistant:

bool crn_comp::pack_color_selectors(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping) {
  crnlib::vector<uint32> remapped_selectors(m_color_selectors.size());
  for (uint i = 0; i < m_color_selectors.size(); i++)
    remapped_selectors[remapping[i]] = m_color_selectors[i];
  symbol_histogram hist(16);
  for (uint32 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++) {
    for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 4)
      hist.inc_freq(selector & 0xF);
  }
  static_huffman_data_model dm;
  dm.init(true, hist, 15);
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  for (uint32 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++) {
    for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 4)
      codec.encode(selector & 0xF, dm);
  }
  codec.stop_encoding(false);
  packed_data.swap(codec.get_encoding_buf());
  return true;
}